

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O3

filepos_t __thiscall
libebml::EbmlElement::OverwriteHead(EbmlElement *this,IOCallback *output,bool bKeepPosition)

{
  int iVar1;
  undefined4 extraout_var;
  filepos_t fVar2;
  
  if (this->ElementPosition != 0) {
    iVar1 = (*output->_vptr_IOCallback[5])(output);
    (*output->_vptr_IOCallback[3])(output,this->ElementPosition,0);
    fVar2 = MakeRenderHead(this,output,bKeepPosition);
    (*output->_vptr_IOCallback[3])(output,CONCAT44(extraout_var,iVar1),0);
    return fVar2;
  }
  return 0;
}

Assistant:

filepos_t EbmlElement::OverwriteHead(IOCallback & output, bool bKeepPosition)
{
  if (ElementPosition == 0) {
    return 0; // the element has not been written
  }

  uint64 CurrentPosition = output.getFilePointer();
  output.setFilePointer(GetElementPosition());
  filepos_t Result = MakeRenderHead(output, bKeepPosition);
  output.setFilePointer(CurrentPosition);
  return Result;
}